

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
__thiscall
duckdb::CreateDuplicateEliminatedJoin
          (duckdb *this,vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns,
          JoinType join_type,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *original_plan,bool perform_delim)

{
  idx_t iVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LogicalWindow_*,_false> _Var3;
  duckdb *this_00;
  LogicalComparisonJoin *this_01;
  const_reference pvVar4;
  LogicalWindow *this_02;
  pointer pBVar5;
  pointer pLVar6;
  pointer pLVar7;
  BoundColumnRefExpression *this_03;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var8;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> __n;
  _Head_base<0UL,_duckdb::LogicalWindow_*,_false> local_90;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_88;
  LogicalTypeId local_79;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_78;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_70;
  duckdb *local_68;
  vector<duckdb::CorrelatedColumnInfo,_true> *local_60;
  LogicalType local_58;
  undefined8 local_38;
  
  this_01 = (LogicalComparisonJoin *)operator_new(0x118);
  LogicalComparisonJoin::LogicalComparisonJoin(this_01,join_type,LOGICAL_DELIM_JOIN);
  *(LogicalComparisonJoin **)this = this_01;
  local_68 = this;
  local_60 = correlated_columns;
  if (!perform_delim) {
    pvVar4 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[](correlated_columns,0);
    this_02 = (LogicalWindow *)operator_new(0x70);
    iVar1 = (pvVar4->binding).table_index;
    LogicalOperator::LogicalOperator((LogicalOperator *)this_02,LOGICAL_WINDOW);
    (this_02->super_LogicalOperator)._vptr_LogicalOperator =
         (_func_int **)&PTR__LogicalOperator_0244e6c8;
    this_02->window_index = iVar1;
    local_79 = 0x7d;
    local_58._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_38 = 0;
    local_90._M_head_impl = this_02;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalTypeId_const&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&local_88,&local_79,(void **)&LogicalType::BIGINT,
               (void **)&local_58);
    pBVar5 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_88);
    pBVar5->start = UNBOUNDED_PRECEDING;
    pBVar5 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_88);
    pBVar5->end = CURRENT_ROW_ROWS;
    pBVar5 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                           *)&local_88);
    local_58._0_8_ = (long)&local_58 + 0x10U;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"delim_index","");
    ::std::__cxx11::string::operator=
              ((string *)&(pBVar5->super_Expression).super_BaseExpression.alias,(string *)&local_58)
    ;
    if (local_58._0_8_ != (long)&local_58 + 0x10U) {
      operator_delete((void *)local_58._0_8_);
    }
    pLVar6 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
             operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                         *)&local_90);
    correlated_columns = local_60;
    local_58._0_8_ = local_88._M_head_impl;
    local_88._M_head_impl = (BoundWindowExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&(pLVar6->super_LogicalOperator).expressions,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_58);
    if ((BoundWindowExpression *)local_58._0_8_ != (BoundWindowExpression *)0x0) {
      (*(((Expression *)local_58._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    pLVar6 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
             operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                         *)&local_90);
    local_70._M_head_impl =
         (original_plan->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (original_plan->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalOperator::AddChild
              (&pLVar6->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_70);
    if (local_70._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_70._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    _Var3._M_head_impl = local_90._M_head_impl;
    local_70._M_head_impl = (LogicalOperator *)0x0;
    local_90._M_head_impl = (LogicalWindow *)0x0;
    _Var2._M_head_impl =
         (original_plan->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (original_plan->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         &(_Var3._M_head_impl)->super_LogicalOperator;
    if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if (local_88._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_88._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    if ((BoundColumnRefExpression *)local_90._M_head_impl != (BoundColumnRefExpression *)0x0) {
      (*((BaseExpression *)&((local_90._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)
        ->_vptr_BaseExpression[1])();
    }
  }
  pLVar7 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
           ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                         *)this);
  local_78._M_head_impl =
       (original_plan->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (original_plan->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalOperator::AddChild
            ((LogicalOperator *)pLVar7,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_78);
  if (local_78._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_78._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_78._M_head_impl = (LogicalOperator *)0x0;
  _Var8._M_head_impl =
       (LogicalComparisonJoin *)
       (correlated_columns->
       super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
       super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var8._M_head_impl !=
      (LogicalComparisonJoin *)
      (correlated_columns->
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>).
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n._M_head_impl = (LogicalComparisonJoin *)0x0;
    do {
      pvVar4 = vector<duckdb::CorrelatedColumnInfo,_true>::operator[]
                         (correlated_columns,(size_type)__n._M_head_impl);
      pLVar7 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
               ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                             *)local_68);
      this_03 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType(&local_58,&pvVar4->type);
      BoundColumnRefExpression::BoundColumnRefExpression(this_03,&local_58,pvVar4->binding,0);
      LogicalType::~LogicalType(&local_58);
      local_90._M_head_impl = (LogicalWindow *)this_03;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pLVar7->duplicate_eliminated_columns,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_90);
      this_00 = local_68;
      if ((BoundColumnRefExpression *)local_90._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*((BaseExpression *)&((local_90._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator
          )->_vptr_BaseExpression[1])();
      }
      pLVar7 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
               ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                             *)this_00);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 &pLVar7->mark_types,&pvVar4->type);
      __n._M_head_impl =
           (LogicalComparisonJoin *)
           ((long)&((__n._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                   _vptr_LogicalOperator + 1);
      _Var8._M_head_impl =
           (LogicalComparisonJoin *)
           (((long)(local_60->
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ).
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_60->
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ).
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
      correlated_columns = local_60;
    } while (__n._M_head_impl < _Var8._M_head_impl);
  }
  return (unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
          )_Var8._M_head_impl;
}

Assistant:

static unique_ptr<LogicalComparisonJoin>
CreateDuplicateEliminatedJoin(const vector<CorrelatedColumnInfo> &correlated_columns, JoinType join_type,
                              unique_ptr<LogicalOperator> original_plan, bool perform_delim) {
	auto delim_join = make_uniq<LogicalComparisonJoin>(join_type, LogicalOperatorType::LOGICAL_DELIM_JOIN);
	if (!perform_delim) {
		// if we are not performing a delim join, we push a row_number() OVER() window operator on the LHS
		// and perform all duplicate elimination on that row number instead
		D_ASSERT(correlated_columns[0].type.id() == LogicalTypeId::BIGINT);
		auto window = make_uniq<LogicalWindow>(correlated_columns[0].binding.table_index);
		auto row_number =
		    make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_ROW_NUMBER, LogicalType::BIGINT, nullptr, nullptr);
		row_number->start = WindowBoundary::UNBOUNDED_PRECEDING;
		row_number->end = WindowBoundary::CURRENT_ROW_ROWS;
		row_number->SetAlias("delim_index");
		window->expressions.push_back(std::move(row_number));
		window->AddChild(std::move(original_plan));
		original_plan = std::move(window);
	}
	delim_join->AddChild(std::move(original_plan));
	for (idx_t i = 0; i < correlated_columns.size(); i++) {
		auto &col = correlated_columns[i];
		delim_join->duplicate_eliminated_columns.push_back(make_uniq<BoundColumnRefExpression>(col.type, col.binding));
		delim_join->mark_types.push_back(col.type);
	}
	return delim_join;
}